

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeUtilsTest.cpp
# Opt level: O2

void __thiscall TimeUtilsTest::test1(TimeUtilsTest *this)

{
  timespec ts;
  timeval tv;
  
  TimeUtils::getCurTime(&tv);
  if (tv.tv_sec == 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/timeUtilsTest.cpp"
               ,0x5c,"Cur time with timeval is 0");
  }
  TimeUtils::getCurTime(&ts);
  if (ts.tv_sec == 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/timeUtilsTest.cpp"
               ,99,"Cur time with timespec is 0");
  }
  return;
}

Assistant:

void TimeUtilsTest::test1()
{
	struct timeval tv;
	
	TimeUtils::getCurTime( &tv );
	
	if ( tv.tv_sec == 0 )
		TestFailed( "Cur time with timeval is 0" );
	
	struct timespec ts;
	
	TimeUtils::getCurTime( &ts );
	
	if ( ts.tv_sec == 0 )
		TestFailed( "Cur time with timespec is 0" );
}